

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

void __thiscall OpenMesh::PropertyT<char>::swap(PropertyT<char> *this,size_t _i0,size_t _i1)

{
  char cVar1;
  pointer pcVar2;
  
  pcVar2 = (this->data_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  cVar1 = pcVar2[_i0];
  pcVar2[_i0] = pcVar2[_i1];
  pcVar2[_i1] = cVar1;
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }